

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O2

uint id3_fill_comment(uchar *buf,uint len,uchar encoding,char *short_comment,char *long_comment,
                     char *language)

{
  ulong uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  uchar *__dest;
  uint uVar4;
  char *pcVar5;
  uchar *__dest_00;
  
  if (buf == (uchar *)0x0) {
    pcVar5 = "buf != NULL";
    uVar4 = 0x22;
  }
  else {
    if (len != 0) {
      if (short_comment != (char *)0x0 || long_comment != (char *)0x0) {
        pcVar5 = "eng";
        if (language != (char *)0x0) {
          pcVar5 = language;
        }
        sVar3 = 0;
        if (short_comment != (char *)0x0) {
          sVar3 = strlen(short_comment);
        }
        uVar1 = 0;
        if (long_comment != (char *)0x0) {
          uVar1 = strlen(long_comment);
        }
        uVar4 = (int)sVar3 + (int)uVar1 + 0xc;
        if (uVar4 <= len) {
          buf[2] = 'M';
          buf[0] = 'C';
          buf[1] = 'O';
          uVar2 = id3_sync_safe((ulong)((int)sVar3 + (int)uVar1 + 6));
          __dest_00 = buf + 10;
          buf[3] = (uchar)(uVar2 >> 0x10);
          buf[4] = (uchar)(uVar2 >> 8);
          buf[5] = (uchar)uVar2;
          buf[6] = encoding;
          *(undefined2 *)(buf + 7) = *(undefined2 *)pcVar5;
          buf[9] = pcVar5[2];
          if (short_comment != (char *)0x0) {
            memcpy(__dest_00,short_comment,sVar3 & 0xffffffff);
            __dest_00 = __dest_00 + (sVar3 & 0xffffffff);
          }
          __dest = __dest_00 + 1;
          *__dest_00 = '\0';
          if (long_comment != (char *)0x0) {
            memcpy(__dest,long_comment,uVar1 & 0xffffffff);
            __dest = __dest + (uVar1 & 0xffffffff);
          }
          *__dest = '\0';
          return uVar4;
        }
      }
      return 0;
    }
    pcVar5 = "len > 0";
    uVar4 = 0x23;
  }
  __assert_fail(pcVar5,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",uVar4,
                "unsigned int id3_fill_comment(unsigned char *, unsigned int, unsigned char, char *, char *, char *)"
               );
}

Assistant:

unsigned int id3_fill_comment(unsigned char *buf, unsigned int len,
                              unsigned char encoding,
                              char *short_comment,
                              char *long_comment,
                              char *language) {
  assert(buf != NULL);
  assert(len > 0);
  if ((short_comment == NULL) &&
      (long_comment == NULL))
    return 0;
  if (language == NULL)
    language = "eng";

  unsigned int short_len = short_comment ? strlen(short_comment) : 0;
  unsigned int long_len  = long_comment  ? strlen(long_comment)  : 0;
  
  unsigned char *ptr = buf;
  unsigned int flen = 1 + 3 + short_len + 1 + long_len + 1;
  if (len < 6 + flen)
    return 0;
  memcpy(ptr, "COM", 3); ptr += 3;
  UINT24_PACK(ptr, id3_sync_safe(flen));
  UINT8_PACK(ptr, encoding);
  memcpy(ptr, language, 3); ptr += 3;
  if (short_comment) {
    memcpy(ptr, short_comment, short_len);
    ptr += short_len;
  }
  UINT8_PACK(ptr, 0x00);
  if (long_comment) {
    memcpy(ptr, long_comment, long_len);
    ptr += long_len;
  }
  UINT8_PACK(ptr, 0x00);

  return 6 + flen;
}